

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

FlatSigningProvider * __thiscall
FlatSigningProvider::Merge(FlatSigningProvider *this,FlatSigningProvider *b)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
  ::_M_merge_unique<std::less<CScriptID>>
            ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
              *)&this->scripts,&(b->scripts)._M_t);
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
  ::_M_merge_unique<std::less<CKeyID>>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
              *)&this->pubkeys,&(b->pubkeys)._M_t);
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
  ::_M_merge_unique<std::less<CKeyID>>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CKey>,std::_Select1st<std::pair<CKeyID_const,CKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
              *)&this->keys,&(b->keys)._M_t);
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
  ::_M_merge_unique<std::less<CKeyID>>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>,std::_Select1st<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
              *)&this->origins,&(b->origins)._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::
    _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,TaprootBuilder>,std::_Select1st<std::pair<XOnlyPubKey_const,TaprootBuilder>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>
    ::_M_merge_unique<std::less<XOnlyPubKey>>
              ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,TaprootBuilder>,std::_Select1st<std::pair<XOnlyPubKey_const,TaprootBuilder>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>
                *)&this->tr_trees,&(b->tr_trees)._M_t);
    return this;
  }
  __stack_chk_fail();
}

Assistant:

FlatSigningProvider& FlatSigningProvider::Merge(FlatSigningProvider&& b)
{
    scripts.merge(b.scripts);
    pubkeys.merge(b.pubkeys);
    keys.merge(b.keys);
    origins.merge(b.origins);
    tr_trees.merge(b.tr_trees);
    return *this;
}